

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scolumn_dfs.c
# Opt level: O2

int scolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
               int_t *xprune,int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int_t *piVar4;
  int_t iVar5;
  uint *puVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int_t *piVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  int local_a8;
  int_t nzlmax;
  int local_a0;
  int local_9c;
  int_t *local_98;
  int local_8c;
  long local_88;
  long local_80;
  int local_74;
  int *local_70;
  int *local_68;
  int *local_60;
  long local_58;
  int *local_50;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  piVar15 = Glu->xsup;
  piVar14 = Glu->supno;
  piVar13 = Glu->lsub;
  piVar4 = Glu->xlsub;
  nzlmax = Glu->nzlmax;
  local_60 = perm_r;
  local_40 = nseg;
  local_38 = segrep;
  local_74 = sp_ienv(3);
  local_a0 = jcol + 1;
  local_9c = jcol + -1;
  local_88 = (long)jcol;
  local_a8 = piVar14[local_88];
  local_58 = (long)local_a8;
  uVar12 = (ulong)(uint)piVar4[local_88];
  local_80 = 0;
  local_98 = piVar4;
  local_8c = local_a8;
  local_70 = piVar15;
  local_68 = piVar14;
  local_50 = lsub_col;
  do {
    iVar8 = lsub_col[local_80];
    lVar7 = (long)iVar8;
    iVar10 = (int)uVar12;
    if (lVar7 == -1) {
      if (jcol == 0) {
        *piVar14 = 0;
        local_8c = 0;
      }
      else {
        iVar8 = piVar15[local_58];
        iVar1 = local_98[local_88];
        lVar16 = (long)local_9c;
        uVar11 = local_98[lVar16];
        lVar7 = (long)(int)uVar11;
        if (((local_74 <= jcol - iVar8) || (iVar10 - iVar1 != ~uVar11 + iVar1)) || (local_a8 == -1))
        {
          if (iVar8 < jcol + -2) {
            iVar8 = local_98[(long)iVar8 + 1];
            uVar12 = (ulong)iVar8;
            local_98[lVar16] = iVar8;
            iVar8 = (iVar1 - uVar11) + iVar8;
            xprune[lVar16] = iVar8;
            local_98[local_88] = iVar8;
            for (; lVar7 < iVar10; lVar7 = lVar7 + 1) {
              piVar13[uVar12] = piVar13[lVar7];
              uVar12 = uVar12 + 1;
            }
          }
          iVar10 = (int)uVar12;
          local_8c = local_8c + 1;
          piVar14[local_88] = local_8c;
        }
      }
      piVar15[(long)local_8c + 1] = local_a0;
      piVar14[local_a0] = local_8c;
      xprune[local_88] = iVar10;
      local_98[local_a0] = iVar10;
      return 0;
    }
    lsub_col[local_80] = -1;
    iVar1 = marker[m * 2 + lVar7];
    if (iVar1 != jcol) {
      marker[m * 2 + lVar7] = jcol;
      iVar2 = local_60[lVar7];
      if ((long)iVar2 == -1) {
        uVar11 = iVar10 + 1;
        uVar12 = (ulong)uVar11;
        piVar13[iVar10] = iVar8;
        if (nzlmax <= (int)uVar11) {
          iVar5 = sLUMemXpand(jcol,uVar11,LSUB,&nzlmax,Glu);
          if (iVar5 != 0) {
            return iVar5;
          }
          piVar13 = Glu->lsub;
          piVar14 = local_68;
          piVar15 = local_70;
        }
        if (iVar1 != local_9c) {
          local_a8 = -1;
        }
      }
      else {
        lVar7 = (long)piVar15[(long)piVar14[iVar2] + 1];
        if (repfnz[lVar7 + -1] == -1) {
          parent[lVar7 + -1] = -1;
          lVar16 = lVar7 + -1;
          repfnz[lVar7 + -1] = iVar2;
          puVar6 = (uint *)(local_98 + lVar16);
LAB_0010f821:
          uVar17 = (ulong)*puVar6;
          iVar8 = xprune[lVar16];
LAB_0010f828:
          lVar7 = (long)(int)uVar17;
          do {
            iVar10 = (int)lVar16;
            if (iVar8 <= (int)lVar7) {
              local_38[*local_40] = iVar10;
              *local_40 = *local_40 + 1;
              lVar16 = (long)parent[iVar10];
              lsub_col = local_50;
              if (lVar16 == -1) goto LAB_0010f983;
              puVar6 = (uint *)(xplore + lVar16);
              goto LAB_0010f821;
            }
            iVar1 = piVar13[lVar7];
            iVar2 = marker[(long)(m * 2) + (long)iVar1];
            if (iVar2 != jcol) {
              marker[(long)(m * 2) + (long)iVar1] = jcol;
              iVar3 = local_60[iVar1];
              if ((long)iVar3 == -1) {
                uVar11 = (int)uVar12 + 1;
                piVar13[(int)uVar12] = iVar1;
                uVar12 = (ulong)uVar11;
                if (nzlmax <= (int)uVar11) {
                  local_48 = (ulong)uVar11;
                  iVar5 = sLUMemXpand(jcol,uVar11,LSUB,&nzlmax,Glu);
                  if (iVar5 != 0) {
                    return iVar5;
                  }
                  piVar13 = Glu->lsub;
                  uVar12 = local_48;
                  piVar14 = local_68;
                  piVar15 = local_70;
                }
                uVar17 = lVar7 + 1;
                if (iVar2 != local_9c) {
                  local_a8 = -1;
                }
                goto LAB_0010f828;
              }
              lVar9 = (long)piVar15[(long)piVar14[iVar3] + 1];
              if (repfnz[lVar9 + -1] == -1) goto LAB_0010f900;
              if (iVar3 < repfnz[lVar9 + -1]) {
                repfnz[lVar9 + -1] = iVar3;
              }
            }
            lVar7 = lVar7 + 1;
          } while( true );
        }
        if (iVar2 < repfnz[lVar7 + -1]) {
          repfnz[lVar7 + -1] = iVar2;
        }
      }
    }
LAB_0010f983:
    local_80 = local_80 + 1;
  } while( true );
LAB_0010f900:
  lVar16 = lVar9 + -1;
  xplore[iVar10] = (int)lVar7 + 1;
  parent[lVar9 + -1] = iVar10;
  repfnz[lVar9 + -1] = iVar3;
  uVar17 = (ulong)(uint)local_98[lVar9 + -1];
  iVar8 = xprune[lVar9 + -1];
  goto LAB_0010f828;
}

Assistant:

int
scolumn_dfs(
	   const int  m,         /* in - number of rows in the matrix */
	   const int  jcol,      /* in */
	   int        *perm_r,   /* in */
	   int        *nseg,     /* modified - with new segments appended */
	   int        *lsub_col, /* in - defines the RHS vector to start the dfs */
	   int        *segrep,   /* modified - with new segments appended */
	   int        *repfnz,   /* modified */
	   int_t      *xprune,   /* modified */
	   int        *marker,   /* modified */
	   int        *parent,	 /* working array */
	   int_t      *xplore,   /* working array */
	   GlobalLU_t *Glu       /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     krep, krow, kmark, kperm;
    int     *marker2;           /* Used for small panel LU */
    int	    fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int	    chperm, chmark, chrep, kchild;
    int_t   xdfs, maxdfs, nextl, k;
    int     kpar, oldrep;
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom, istop;	/* Used to compress row subscripts */
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax, mem_error;
    int     maxsuper;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(3);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];

    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
    	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];    	

	/* krow was visited before, go to the next nonz */
        if ( kmark == jcol ) continue; 

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

   	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow; 	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		if ( mem_error ) return (mem_error);
		lsub = Glu->lsub;
	    }
            if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
  	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
	    	if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
	 	parent[krep] = oldrep;
	  	repfnz[krep] = kperm;
		xdfs = xlsub[krep];
	  	maxdfs = xprune[krep];

		do {
		    /* 
		     * For each unmarked kchild of krep 
		     */
		    while ( xdfs < maxdfs ) {

		   	kchild = lsub[xdfs];
			xdfs++;
		  	chmark = marker2[kchild];

		   	if ( chmark != jcol ) { /* Not reached yet */
		   	    marker2[kchild] = jcol;
		   	    chperm = perm_r[kchild];

		   	    /* Case kchild is in L: place it in L[*,k] */
		   	    if ( chperm == SLU_EMPTY ) {
			    	lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    mem_error =
					 sLUMemXpand(jcol,nextl,LSUB,&nzlmax,Glu);
				    if ( mem_error ) return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
		    	    	/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
			         *   been explored, update its repfnz[*]
			         */
		   	    	chrep = xsup[supno[chperm]+1] - 1;
		   		myfnz = repfnz[chrep];
		   		if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
     				  	repfnz[chrep] = chperm;
				} else {
		        	    /* Continue dfs at super-rep of kchild */
		   		    xplore[krep] = xdfs;	
		   		    oldrep = krep;
		   		    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
		    		    repfnz[krep] = chperm;
		   		    xdfs = xlsub[krep];     
				    maxdfs = xprune[krep];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
	   	     *    place supernode-rep krep in postorder DFS.
	   	     *    backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xprune[krep];

		} while ( kpar != SLU_EMPTY ); 	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
   	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

#ifdef T2_SUPER
	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;
#endif
	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first and last columns of
   	 * a supernode. (first for num values, last for pruning)
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1-1) ) {	/* >= 3 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
	        ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		istop = ito + jptr - jm1ptr;
		xprune[jcolm1] = istop; /* Initialize xprune[jcol-1] */
		xlsub[jcol] = istop;
		for (ifrom = jm1ptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;            /* = istop + length(jcol) */
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */ 
    
    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xprune[jcol]   = nextl;	/* Initialize upper bound for pruning */
    xlsub[jcolp1]  = nextl;

    return 0;
}